

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  tuple<SudokuGitter,_SudokuGitter> local_110;
  undefined1 local_c0 [8];
  tuple<SudokuGitter,_SudokuGitter> bigGitter;
  SudokuGitter local_60;
  undefined1 local_38 [8];
  SudokuGitter gitter;
  int elements;
  
  gitter._36_4_ = 9;
  mainClassicSudoku((SudokuGitter *)local_38,9);
  SudokuGitter::SudokuGitter(&local_60,(SudokuGitter *)local_38);
  visualizeClassicSudoku(&local_60);
  SudokuGitter::~SudokuGitter(&local_60);
  mainBigSudoku((tuple<SudokuGitter,_SudokuGitter> *)local_c0,gitter._36_4_);
  std::tuple<SudokuGitter,_SudokuGitter>::tuple
            (&local_110,(tuple<SudokuGitter,_SudokuGitter> *)local_c0);
  visualizeBigSudoku(&local_110);
  std::tuple<SudokuGitter,_SudokuGitter>::~tuple(&local_110);
  std::tuple<SudokuGitter,_SudokuGitter>::~tuple((tuple<SudokuGitter,_SudokuGitter> *)local_c0);
  SudokuGitter::~SudokuGitter((SudokuGitter *)local_38);
  return 0;
}

Assistant:

int main() {
    int elements = 9;
    SudokuGitter gitter = mainClassicSudoku(elements);
    visualizeClassicSudoku(gitter);

    tuple<SudokuGitter, SudokuGitter> bigGitter = mainBigSudoku(elements);
    visualizeBigSudoku(bigGitter);
}